

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::SamFormatParser::ParseSamLine(SamFormatParser *this,string *line)

{
  int iVar1;
  string firstToken;
  string restOfLine;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  value_type local_30;
  
  if (4 < line->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
    std::__cxx11::string::substr((ulong)&local_30,(ulong)line);
    if ((local_48 == _DAT_001b4240) &&
       ((local_48 == 0 ||
        (iVar1 = bcmp(local_50,Constants::SAM_HD_BEGIN_TOKEN_abi_cxx11_,local_48), iVar1 == 0)))) {
      ParseHDLine(this,&local_30);
    }
    else if ((local_48 == DAT_001b42c0) &&
            ((local_48 == 0 ||
             (iVar1 = bcmp(local_50,Constants::SAM_SQ_BEGIN_TOKEN_abi_cxx11_,local_48), iVar1 == 0))
            )) {
      ParseSQLine(this,&local_30);
    }
    else if ((local_48 == DAT_001b43a0) &&
            ((local_48 == 0 ||
             (iVar1 = bcmp(local_50,Constants::SAM_RG_BEGIN_TOKEN_abi_cxx11_,local_48), iVar1 == 0))
            )) {
      ParseRGLine(this,&local_30);
    }
    else if ((local_48 == DAT_001b4540) &&
            ((local_48 == 0 ||
             (iVar1 = bcmp(local_50,Constants::SAM_PG_BEGIN_TOKEN_abi_cxx11_,local_48), iVar1 == 0))
            )) {
      ParsePGLine(this,&local_30);
    }
    else if ((local_48 == DAT_001b4600) &&
            ((local_48 == 0 ||
             (iVar1 = bcmp(local_50,Constants::SAM_CO_BEGIN_TOKEN_abi_cxx11_,local_48), iVar1 == 0))
            )) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_header->Comments,&local_30);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return;
  }
  return;
}

Assistant:

void SamFormatParser::ParseSamLine(const std::string& line)
{

    // skip if line is not long enough to contain true values
    if (line.length() < 5) {
        return;
    }

    // determine token at beginning of line
    const std::string firstToken = line.substr(0, 3);
    const std::string restOfLine = line.substr(4);
    if (firstToken == Constants::SAM_HD_BEGIN_TOKEN) {
        ParseHDLine(restOfLine);
    } else if (firstToken == Constants::SAM_SQ_BEGIN_TOKEN) {
        ParseSQLine(restOfLine);
    } else if (firstToken == Constants::SAM_RG_BEGIN_TOKEN) {
        ParseRGLine(restOfLine);
    } else if (firstToken == Constants::SAM_PG_BEGIN_TOKEN) {
        ParsePGLine(restOfLine);
    } else if (firstToken == Constants::SAM_CO_BEGIN_TOKEN) {
        ParseCOLine(restOfLine);
    }
}